

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseParenthesisExpression(Parser *this)

{
  TokenType TVar1;
  Parser *in_RSI;
  allocator local_51;
  string local_50;
  undefined1 local_19;
  Parser *this_local;
  unique_ptr<Expression,_std::default_delete<Expression>_> *expr;
  
  this_local = this;
  nextToken(in_RSI);
  local_19 = 0;
  parseExpression(this);
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 != RIGHT_PARENTHESIS) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Expected \').\'",&local_51);
    parseError(in_RSI,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  nextToken(in_RSI);
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseParenthesisExpression() {
	nextToken(); //Eat the '('
	auto expr = parseExpression();

	if (mCurrentToken.type() != TokenType::RIGHT_PARENTHESIS) {
		parseError("Expected ').'");
	}

	nextToken(); //Eat the ')'
	return expr;
}